

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O1

int xmlparse(void)

{
  size_t __n;
  short sVar1;
  pointer pcVar2;
  Attributes *pAVar3;
  byte *pbVar4;
  int iVar5;
  byte *__dest;
  string *psVar6;
  long lVar7;
  byte *pbVar8;
  char cVar9;
  uint uVar10;
  undefined8 *puVar11;
  byte *pbVar12;
  byte *__src;
  undefined8 *puVar13;
  long lVar14;
  ulong uVar15;
  byte *__dest_00;
  uint uVar16;
  char *str;
  Attributes *this;
  yy_state_t yyssa [200];
  XMLSTYPE yyvsa [200];
  byte *local_750;
  byte local_748 [208];
  byte local_678 [1608];
  
  xmlchar = -2;
  uVar16 = 0;
  lVar14 = 200;
  pbVar8 = local_748;
  pbVar12 = local_678;
  __src = pbVar8;
  local_750 = pbVar12;
  do {
    *pbVar8 = (byte)uVar16;
    if (__src + lVar14 + -1 <= pbVar8) {
      cVar9 = '\x04';
      if (lVar14 < 10000) {
        lVar7 = (long)pbVar8 - (long)__src;
        __n = lVar7 + 1;
        lVar14 = lVar14 * 2;
        if (9999 < lVar14) {
          lVar14 = 10000;
        }
        __dest = (byte *)malloc(lVar14 * 9 + 7);
        if (__dest == (byte *)0x0) {
          cVar9 = '\x04';
          pbVar4 = __src;
        }
        else {
          memcpy(__dest,__src,__n);
          uVar15 = lVar14 + 0xe;
          if (-1 < (long)(lVar14 + 7U)) {
            uVar15 = lVar14 + 7U;
          }
          __dest_00 = __dest + (uVar15 & 0xfffffffffffffff8);
          memcpy(__dest_00,local_750,__n * 8);
          cVar9 = '\0';
          pbVar4 = __dest;
          local_750 = __dest_00;
          if (__src != local_748) {
            free(__src);
          }
        }
        __src = pbVar4;
        if (__dest != (byte *)0x0) {
          pbVar8 = __src + lVar7;
          pbVar12 = local_750 + __n * 8 + -8;
          cVar9 = (lVar14 <= (long)__n) * '\t';
        }
      }
      if (cVar9 != '\0') {
        iVar5 = 1;
        if (cVar9 == '\x04') {
          xmlerror("memory exhausted");
          iVar5 = 2;
        }
        goto LAB_0030e7ba;
      }
    }
    if (uVar16 == 0x19) {
      iVar5 = 0;
      goto LAB_0030e7ba;
    }
    sVar1 = yypact[(int)uVar16];
    if (sVar1 != -0x88) {
      if ((xmlchar == -2) && (xmlchar = XmlScan::nexttoken(global_scan), 0xff < xmlchar)) {
        xmllval = (XMLSTYPE)global_scan->lvalue;
        global_scan->lvalue = (string *)0x0;
      }
      if ((long)xmlchar < 1) {
        xmlchar = 0;
        iVar5 = 0;
      }
      else {
        if (xmlchar == 0x100) {
          xmlchar = 0x101;
          goto LAB_0030e7b5;
        }
        iVar5 = 2;
        if (xmlchar < 0x10b) {
          iVar5 = (int)""[xmlchar];
        }
      }
      uVar10 = sVar1 + iVar5;
      if ((0xcd < uVar10) || (iVar5 != yycheck[uVar10])) goto LAB_0030e081;
      uVar16 = (uint)yytable[uVar10];
      if (yytable[uVar10] == 0) {
        iVar5 = 0;
        goto LAB_0030e094;
      }
      *(XMLSTYPE *)(pbVar12 + 8) = xmllval;
      xmlchar = -2;
      goto LAB_0030e72b;
    }
LAB_0030e081:
    iVar5 = (int)""[(int)uVar16];
    if (""[(int)uVar16] == '\0') {
      xmlnerrs = xmlnerrs + 1;
      xmlerror("syntax error");
      goto LAB_0030e7b5;
    }
LAB_0030e094:
    lVar7 = (long)""[iVar5];
    this = *(Attributes **)(pbVar12 + (1 - lVar7) * 8);
    switch(iVar5) {
    case 10:
      this = (Attributes *)operator_new(0x20);
      this->elementname = (string *)&(this->bogus_uri)._M_string_length;
      (this->bogus_uri)._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&(this->bogus_uri)._M_string_length = 0;
      goto LAB_0030e453;
    case 0xb:
      this = *(Attributes **)(pbVar12 + -8);
      std::__cxx11::string::_M_append((char *)this,**(ulong **)pbVar12);
      puVar13 = *(undefined8 **)pbVar12;
      if (puVar13 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar13 != puVar13 + 2) {
          operator_delete((undefined8 *)*puVar13);
        }
        operator_delete(puVar13);
      }
      global_scan->curmode = AttValueSingleMode;
      break;
    case 0xc:
      this = *(Attributes **)(pbVar12 + -8);
      std::__cxx11::string::push_back((char)this);
LAB_0030e453:
      global_scan->curmode = AttValueSingleMode;
      break;
    case 0xd:
      this = (Attributes *)operator_new(0x20);
      this->elementname = (string *)&(this->bogus_uri)._M_string_length;
      (this->bogus_uri)._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&(this->bogus_uri)._M_string_length = 0;
      goto LAB_0030e58f;
    case 0xe:
      this = *(Attributes **)(pbVar12 + -8);
      std::__cxx11::string::_M_append((char *)this,**(ulong **)pbVar12);
      puVar13 = *(undefined8 **)pbVar12;
      if (puVar13 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar13 != puVar13 + 2) {
          operator_delete((undefined8 *)*puVar13);
        }
        operator_delete(puVar13);
      }
      global_scan->curmode = AttValueDoubleMode;
      break;
    case 0xf:
      this = *(Attributes **)(pbVar12 + -8);
      std::__cxx11::string::push_back((char)this);
LAB_0030e58f:
      global_scan->curmode = AttValueDoubleMode;
      break;
    case 0x10:
    case 0x11:
    case 0x16:
    case 0x38:
    case 0x45:
    case 0x46:
      this = *(Attributes **)(pbVar12 + -8);
      break;
    case 0x12:
      global_scan->curmode = NameMode;
      puVar13 = *(undefined8 **)pbVar12;
      goto LAB_0030e685;
    case 0x13:
      global_scan->curmode = CommentMode;
      goto LAB_0030e617;
    case 0x14:
LAB_0030e617:
      puVar13 = *(undefined8 **)(pbVar12 + -0x18);
      goto LAB_0030e685;
    case 0x15:
      puVar13 = *(undefined8 **)(pbVar12 + -8);
      if (puVar13 == (undefined8 *)0x0) {
        str = "Processing instructions are not supported";
      }
      else {
        puVar11 = (undefined8 *)*puVar13;
        str = "Processing instructions are not supported";
LAB_0030e810:
        if (puVar11 != puVar13 + 2) {
          operator_delete(puVar11);
        }
        operator_delete(puVar13);
      }
LAB_0030e834:
      xmlerror(str);
      xmlnerrs = xmlnerrs + 1;
LAB_0030e7b5:
      iVar5 = 1;
LAB_0030e7ba:
      if (__src != local_748) {
        free(__src);
      }
      return iVar5;
    case 0x17:
      global_scan->curmode = CDataMode;
      puVar13 = *(undefined8 **)(pbVar12 + -0x40);
      goto LAB_0030e685;
    case 0x20:
      puVar13 = *(undefined8 **)(pbVar12 + -0x40);
      if (puVar13 != (undefined8 *)0x0) {
        puVar11 = (undefined8 *)*puVar13;
        str = "DTD\'s not supported";
        goto LAB_0030e810;
      }
      str = "DTD\'s not supported";
      goto LAB_0030e834;
    case 0x27:
      (*handler->_vptr_ContentHandler[0xb])(handler,*(undefined8 *)pbVar12);
      goto LAB_0030e63a;
    case 0x28:
      (*handler->_vptr_ContentHandler[0xc])(handler,*(undefined8 *)pbVar12);
      goto LAB_0030e63a;
    case 0x2e:
      (*handler->_vptr_ContentHandler[8])
                (handler,*(undefined8 **)pbVar12 + 1,**(undefined8 **)pbVar12);
      pAVar3 = *(Attributes **)pbVar12;
      if (pAVar3 != (Attributes *)0x0) {
        Attributes::~Attributes(pAVar3);
        operator_delete(pAVar3);
      }
      break;
    case 0x2f:
      (*handler->_vptr_ContentHandler[8])
                (handler,*(undefined8 **)(pbVar12 + -0x10) + 1,**(undefined8 **)(pbVar12 + -0x10));
      pAVar3 = *(Attributes **)(pbVar12 + -0x10);
      if (pAVar3 != (Attributes *)0x0) {
        Attributes::~Attributes(pAVar3);
        operator_delete(pAVar3);
      }
      puVar13 = *(undefined8 **)pbVar12;
      if (puVar13 == (undefined8 *)0x0) break;
      goto LAB_0030e642;
    case 0x30:
      (*handler->_vptr_ContentHandler[7])
                (handler,*(undefined8 **)(pbVar12 + -8) + 1,**(undefined8 **)(pbVar12 + -8));
      this = *(Attributes **)(pbVar12 + -8);
      break;
    case 0x31:
    case 0x32:
      (*handler->_vptr_ContentHandler[7])
                (handler,*(undefined8 **)(pbVar12 + -0x10) + 1,**(undefined8 **)(pbVar12 + -0x10));
      this = *(Attributes **)(pbVar12 + -0x10);
      break;
    case 0x33:
      (*handler->_vptr_ContentHandler[7])
                (handler,*(undefined8 **)(pbVar12 + -0x18) + 1,**(undefined8 **)(pbVar12 + -0x18));
      this = *(Attributes **)(pbVar12 + -0x18);
      break;
    case 0x34:
      this = (Attributes *)operator_new(0x78);
      psVar6 = *(string **)pbVar12;
      (this->bogus_uri)._M_dataplus._M_p = (pointer)&(this->bogus_uri).field_2;
      (this->bogus_uri)._M_string_length = 0;
      (this->bogus_uri).field_2._M_local_buf[0] = '\0';
      (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
      (this->prefix)._M_string_length = 0;
      (this->prefix).field_2._M_local_buf[0] = '\0';
      (this->value).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->value).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->name).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->value).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->name).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->name).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this->elementname = psVar6;
      global_scan->curmode = SNameMode;
      break;
    case 0x35:
      this = *(Attributes **)(pbVar12 + -8);
      Attributes::add_attribute
                (this,(string *)**(undefined8 **)pbVar12,(string *)(*(undefined8 **)pbVar12)[1]);
      if (*(void **)pbVar12 != (void *)0x0) {
        operator_delete(*(void **)pbVar12);
      }
      global_scan->curmode = SNameMode;
      break;
    case 0x36:
      this = (Attributes *)operator_new(0x10);
      this->elementname = *(string **)(pbVar12 + -0x10);
      (this->bogus_uri)._M_dataplus._M_p = *(pointer *)pbVar12;
      break;
    case 0x37:
      global_scan->curmode = NameMode;
      puVar13 = *(undefined8 **)(pbVar12 + -8);
LAB_0030e685:
      if (puVar13 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar13 != puVar13 + 2) {
          operator_delete((undefined8 *)*puVar13);
        }
        operator_delete(puVar13);
      }
      break;
    case 0x39:
      this = *(Attributes **)(pbVar12 + -0x10);
      break;
    case 0x3a:
    case 0x3c:
    case 0x3f:
    case 0x40:
      global_scan->curmode = CharDataMode;
      break;
    case 0x3b:
    case 0x3e:
      print_content(*(string **)pbVar12);
      puVar13 = *(undefined8 **)pbVar12;
      if (puVar13 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar13 != puVar13 + 2) {
          operator_delete((undefined8 *)*puVar13);
        }
        operator_delete(puVar13);
      }
      global_scan->curmode = CharDataMode;
      break;
    case 0x3d:
      psVar6 = (string *)operator_new(0x20);
      (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
      psVar6->_M_string_length = 0;
      (psVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)psVar6);
      print_content(psVar6);
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar6->field_2) {
        operator_delete(pcVar2);
      }
      operator_delete(psVar6);
      global_scan->curmode = CharDataMode;
      break;
    case 0x41:
      uVar16 = convertEntityRef(*(string **)pbVar12);
      this = (Attributes *)((ulong)this & 0xffffffff00000000 | (ulong)uVar16);
LAB_0030e63a:
      puVar13 = *(undefined8 **)pbVar12;
      if (puVar13 != (undefined8 *)0x0) {
LAB_0030e642:
        if ((undefined8 *)*puVar13 != puVar13 + 2) {
          operator_delete((undefined8 *)*puVar13);
        }
        operator_delete(puVar13);
      }
      break;
    case 0x42:
      psVar6 = *(string **)pbVar12;
      uVar16 = convertCharRef(psVar6);
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar6->field_2) {
        operator_delete(pcVar2);
      }
      this = (Attributes *)((ulong)this & 0xffffffff00000000 | (ulong)uVar16);
      operator_delete(psVar6);
      break;
    case 0x43:
      global_scan->curmode = NameMode;
      break;
    case 0x44:
      global_scan->curmode = CharRefMode;
    }
    pbVar12 = pbVar12 + lVar7 * -8;
    pbVar8 = pbVar8 + -lVar7;
    *(Attributes **)(pbVar12 + 8) = this;
    uVar16 = (int)*(short *)("" + (long)""[iVar5] * 2 + 0x3c) + (uint)*pbVar8;
    if ((uVar16 < 0xce) && ((int)yycheck[uVar16] == (uint)*pbVar8)) {
      uVar16 = (uint)yytable[uVar16];
    }
    else {
      uVar16 = (uint)*(char *)((long)yypgoto + (long)""[iVar5] + 0x1e);
    }
LAB_0030e72b:
    pbVar12 = pbVar12 + 8;
    pbVar8 = pbVar8 + 1;
  } while( true );
}

Assistant:

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = XMLEMPTY; /* Cause a token to be read.  */

  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == XMLEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= XMLEOF)
    {
      yychar = XMLEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == XMLerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = XMLUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = XMLEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 10: /* attsinglemid: '\''  */
#line 128 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                   { (yyval.str) = new string; global_scan->setmode(XmlScan::AttValueSingleMode); }
#line 1349 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 11: /* attsinglemid: attsinglemid ATTVALUE  */
#line 129 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                      { (yyval.str) = (yyvsp[-1].str); *(yyval.str) += *(yyvsp[0].str); delete (yyvsp[0].str); global_scan->setmode(XmlScan::AttValueSingleMode); }
#line 1355 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 12: /* attsinglemid: attsinglemid Reference  */
#line 130 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                       { (yyval.str) = (yyvsp[-1].str); *(yyval.str) += (yyvsp[0].i); global_scan->setmode(XmlScan::AttValueSingleMode); }
#line 1361 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 13: /* attdoublemid: '"'  */
#line 131 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                  { (yyval.str) = new string; global_scan->setmode(XmlScan::AttValueDoubleMode); }
#line 1367 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 14: /* attdoublemid: attdoublemid ATTVALUE  */
#line 132 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                      { (yyval.str) = (yyvsp[-1].str); *(yyval.str) += *(yyvsp[0].str); delete (yyvsp[0].str); global_scan->setmode(XmlScan::AttValueDoubleMode); }
#line 1373 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 15: /* attdoublemid: attdoublemid Reference  */
#line 133 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                       { (yyval.str) = (yyvsp[-1].str); *(yyval.str) += (yyvsp[0].i); global_scan->setmode(XmlScan::AttValueDoubleMode); }
#line 1379 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 16: /* AttValue: attsinglemid '\''  */
#line 134 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                            { (yyval.str) = (yyvsp[-1].str); }
#line 1385 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 17: /* AttValue: attdoublemid '"'  */
#line 135 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                             { (yyval.str) = (yyvsp[-1].str); }
#line 1391 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 18: /* elemstart: ELEMBRACE  */
#line 136 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                     { global_scan->setmode(XmlScan::NameMode); delete (yyvsp[0].str); }
#line 1397 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 19: /* commentstart: COMMBRACE '!' '-' '-'  */
#line 137 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                    { global_scan->setmode(XmlScan::CommentMode); delete (yyvsp[-3].str); }
#line 1403 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 20: /* Comment: commentstart COMMENT '-' '-' '>'  */
#line 138 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                          { delete (yyvsp[-3].str); }
#line 1409 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 21: /* PI: COMMBRACE '?'  */
#line 139 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                  { delete (yyvsp[-1].str); yyerror("Processing instructions are not supported"); YYERROR; }
#line 1415 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 22: /* CDSect: CDStart CDATA CDEnd  */
#line 140 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                            { (yyval.str) = (yyvsp[-1].str); }
#line 1421 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 23: /* CDStart: COMMBRACE '!' '[' 'C' 'D' 'A' 'T' 'A' '['  */
#line 141 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                                   { global_scan->setmode(XmlScan::CDataMode); delete (yyvsp[-8].str); }
#line 1427 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 32: /* doctypedecl: COMMBRACE '!' 'D' 'O' 'C' 'T' 'Y' 'P' 'E'  */
#line 152 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                                       { delete (yyvsp[-8].str); yyerror("DTD's not supported"); YYERROR; }
#line 1433 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 39: /* VersionInfo: S 'v' 'e' 'r' 's' 'i' 'o' 'n' Eq AttValue  */
#line 160 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                                       { handler->setVersion(*(yyvsp[0].str)); delete (yyvsp[0].str); }
#line 1439 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 40: /* EncodingDecl: S 'e' 'n' 'c' 'o' 'd' 'i' 'n' 'g' Eq AttValue  */
#line 161 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                                            { handler->setEncoding(*(yyvsp[0].str)); delete (yyvsp[0].str); }
#line 1445 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 46: /* element: EmptyElemTag  */
#line 168 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                      { handler->endElement((yyvsp[0].attr)->getelemURI(),(yyvsp[0].attr)->getelemName(),(yyvsp[0].attr)->getelemName()); delete (yyvsp[0].attr); }
#line 1451 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 47: /* element: STag content ETag  */
#line 169 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                             { handler->endElement((yyvsp[-2].attr)->getelemURI(),(yyvsp[-2].attr)->getelemName(),(yyvsp[-2].attr)->getelemName()); delete (yyvsp[-2].attr); delete (yyvsp[0].str); }
#line 1457 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 48: /* STag: stagstart '>'  */
#line 171 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                    { handler->startElement((yyvsp[-1].attr)->getelemURI(),(yyvsp[-1].attr)->getelemName(),(yyvsp[-1].attr)->getelemName(),*(yyvsp[-1].attr)); (yyval.attr) = (yyvsp[-1].attr); }
#line 1463 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 49: /* STag: stagstart S '>'  */
#line 172 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                        { handler->startElement((yyvsp[-2].attr)->getelemURI(),(yyvsp[-2].attr)->getelemName(),(yyvsp[-2].attr)->getelemName(),*(yyvsp[-2].attr)); (yyval.attr) = (yyvsp[-2].attr); }
#line 1469 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 50: /* EmptyElemTag: stagstart '/' '>'  */
#line 173 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                { handler->startElement((yyvsp[-2].attr)->getelemURI(),(yyvsp[-2].attr)->getelemName(),(yyvsp[-2].attr)->getelemName(),*(yyvsp[-2].attr)); (yyval.attr) = (yyvsp[-2].attr); }
#line 1475 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 51: /* EmptyElemTag: stagstart S '/' '>'  */
#line 174 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                    { handler->startElement((yyvsp[-3].attr)->getelemURI(),(yyvsp[-3].attr)->getelemName(),(yyvsp[-3].attr)->getelemName(),*(yyvsp[-3].attr)); (yyval.attr) = (yyvsp[-3].attr); }
#line 1481 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 52: /* stagstart: elemstart NAME  */
#line 176 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                          { (yyval.attr) = new Attributes((yyvsp[0].str)); global_scan->setmode(XmlScan::SNameMode); }
#line 1487 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 53: /* stagstart: stagstart SAttribute  */
#line 177 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                  { (yyval.attr) = (yyvsp[-1].attr); (yyval.attr)->add_attribute( (yyvsp[0].pair)->name, (yyvsp[0].pair)->value); delete (yyvsp[0].pair); global_scan->setmode(XmlScan::SNameMode); }
#line 1493 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 54: /* SAttribute: SNAME Eq AttValue  */
#line 178 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                              { (yyval.pair) = new NameValue; (yyval.pair)->name = (yyvsp[-2].str); (yyval.pair)->value = (yyvsp[0].str); }
#line 1499 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 55: /* etagbrace: COMMBRACE '/'  */
#line 179 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                         { global_scan->setmode(XmlScan::NameMode); delete (yyvsp[-1].str); }
#line 1505 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 56: /* ETag: etagbrace NAME '>'  */
#line 180 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                         { (yyval.str) = (yyvsp[-1].str); }
#line 1511 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 57: /* ETag: etagbrace NAME S '>'  */
#line 181 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                             { (yyval.str) = (yyvsp[-2].str); }
#line 1517 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 58: /* content: %empty  */
#line 183 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
         { global_scan->setmode(XmlScan::CharDataMode); }
#line 1523 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 59: /* content: content CHARDATA  */
#line 184 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                            { print_content( *(yyvsp[0].str) ); delete (yyvsp[0].str); global_scan->setmode(XmlScan::CharDataMode); }
#line 1529 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 60: /* content: content element  */
#line 185 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                           { global_scan->setmode(XmlScan::CharDataMode); }
#line 1535 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 61: /* content: content Reference  */
#line 186 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                             { string *tmp=new string(); *tmp += (yyvsp[0].i); print_content(*tmp); delete tmp; global_scan->setmode(XmlScan::CharDataMode); }
#line 1541 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 62: /* content: content CDSect  */
#line 187 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                          { print_content( *(yyvsp[0].str) ); delete (yyvsp[0].str); global_scan->setmode(XmlScan::CharDataMode); }
#line 1547 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 63: /* content: content PI  */
#line 188 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                      { global_scan->setmode(XmlScan::CharDataMode); }
#line 1553 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 64: /* content: content Comment  */
#line 189 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                           { global_scan->setmode(XmlScan::CharDataMode); }
#line 1559 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 65: /* Reference: EntityRef  */
#line 191 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                     { (yyval.i) = convertEntityRef(*(yyvsp[0].str)); delete (yyvsp[0].str); }
#line 1565 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 66: /* Reference: CharRef  */
#line 192 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                     { (yyval.i) = convertCharRef(*(yyvsp[0].str)); delete (yyvsp[0].str); }
#line 1571 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 67: /* refstart: '&'  */
#line 194 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
              { global_scan->setmode(XmlScan::NameMode); }
#line 1577 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 68: /* charrefstart: refstart '#'  */
#line 195 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                           { global_scan->setmode(XmlScan::CharRefMode); }
#line 1583 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 69: /* CharRef: charrefstart CHARREF ';'  */
#line 196 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                                  { (yyval.str) = (yyvsp[-1].str); }
#line 1589 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;

  case 70: /* EntityRef: refstart NAME ';'  */
#line 197 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/ghidra/ghidra/Ghidra/Features/Decompiler/src/decompile/cpp/xml.y"
                             { (yyval.str) = (yyvsp[-1].str); }
#line 1595 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"
    break;


#line 1599 "/workspace/llm4binary/github/license_all_cmakelists_1510/starfleetcadet75[P]sleigh-disasm/build_O1/ghidra/bison/xml.cpp"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == XMLEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (YY_("syntax error"));
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= XMLEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == XMLEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval);
          yychar = XMLEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != XMLEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}